

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O1

int Cec_ManHandleSpecialCases(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  undefined1 *puVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint iOut;
  Gia_Obj_t *pGVar16;
  timespec ts;
  long local_70;
  timespec local_60;
  long local_50;
  Gia_Obj_t *local_48;
  undefined1 *local_40;
  Vec_Int_t *local_38;
  
  iVar8 = clock_gettime(3,&local_60);
  if (iVar8 < 0) {
    local_70 = -1;
  }
  else {
    local_70 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  pGVar12 = p;
  Gia_ManSetPhase(p);
  local_38 = p->vCos;
  iVar8 = local_38->nSize;
  iVar11 = p->nRegs;
  local_50 = CONCAT44(local_50._4_4_,iVar11);
  uVar9 = iVar8 - iVar11;
  if (uVar9 != 0 && iVar11 <= iVar8) {
    local_40 = (undefined1 *)(ulong)uVar9;
    iOut = 0;
    pGVar12 = (Gia_Man_t *)0x0;
    do {
      if ((long)iVar8 <= (long)pGVar12) {
LAB_00638d86:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = local_38->pArray[(long)pGVar12];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_00638d67:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = p->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      puVar1 = (undefined1 *)((long)&pGVar12->pName + 1);
      if (local_40 <= puVar1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((long)iVar8 <= (long)puVar1) goto LAB_00638d86;
      iVar5 = local_38->pArray[(long)((long)&pGVar12->pName + 1)];
      lVar13 = (long)iVar5;
      if ((lVar13 < 0) || (p->nObjs <= iVar5)) goto LAB_00638d67;
      pGVar2 = pGVar6 + iVar10;
      uVar14 = *(ulong *)(pGVar6 + lVar13);
      if ((long)(uVar14 ^ *(ulong *)pGVar2) < 0) {
        if (pPars->fSilent == 0) {
          Abc_Print((int)uVar14,
                    "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ",
                    (ulong)iOut);
          iVar11 = 3;
          iVar8 = clock_gettime(3,&local_60);
          if (iVar8 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          Abc_Print(iVar11,"%s =","Time");
          Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar13 - local_70) / 1000000.0);
        }
        pPars->iOutFail = iOut;
        Cec_ManTransformPattern(p,iOut,(int *)0x0);
        return 0;
      }
      pGVar6 = pGVar6 + lVar13;
      pGVar16 = pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff);
      pGVar3 = pGVar6 + -(uVar14 & 0x1fffffff);
      uVar14 = *(ulong *)pGVar16;
      if (((uint)uVar14 & 0x9fffffff) == 0x9fffffff) {
        uVar15 = (uint)(uVar14 >> 0x20);
        if (p->vCis->nSize - iVar11 <= (int)(uVar15 & 0x1fffffff)) {
LAB_0063892a:
          if ((p->vCis->nSize - iVar11 <= (int)(uVar15 & 0x1fffffff)) ||
             ((~*(ulong *)pGVar3 & 0x1fffffff1fffffff) != 0)) goto LAB_00638960;
          goto LAB_00638aa2;
        }
        bVar7 = true;
        if (((uint)*(ulong *)pGVar3 & 0x9fffffff) == 0x9fffffff) {
          bVar7 = p->vCis->nSize - iVar11 <= (int)((uint)(*(ulong *)pGVar3 >> 0x20) & 0x1fffffff);
        }
        local_48 = pGVar6;
        if ((bVar7) || (pGVar16 == pGVar3)) goto LAB_0063892a;
        if (pPars->fSilent == 0) {
          Abc_Print((uint)uVar14,
                    "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ",
                    (ulong)iOut);
          iVar11 = 3;
          iVar8 = clock_gettime(3,&local_60);
          if (iVar8 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          Abc_Print(iVar11,"%s =","Time");
          Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar13 - local_70) / 1000000.0);
        }
        pPars->iOutFail = iOut;
        Cec_ManTransformPattern(p,iOut,(int *)0x0);
        if (((*(uint *)local_48 ^ *(uint *)pGVar2) >> 0x1d & 1) != 0) {
          __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                        ,0xb3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
        }
        uVar14 = *(ulong *)pGVar16;
LAB_00638d28:
        if (-1 < (int)uVar14) {
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
LAB_00638d37:
        piVar4 = &p->pCexComb[1].iPo + ((uint)(uVar14 >> 0x25) & 0xffffff);
        *piVar4 = *piVar4 | 1 << ((byte)(uVar14 >> 0x20) & 0x1f);
        return 0;
      }
LAB_00638960:
      if (((((uint)*(ulong *)pGVar3 & 0x9fffffff) == 0x9fffffff) &&
          (uVar14 = ~uVar14, (uVar14 & 0x1fffffff1fffffff) == 0)) &&
         ((int)((uint)(*(ulong *)pGVar3 >> 0x20) & 0x1fffffff) < p->vCis->nSize - iVar11)) {
LAB_00638aa2:
        local_48 = pGVar6;
        if (pPars->fSilent == 0) {
          Abc_Print((int)uVar14,
                    "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ",
                    (ulong)iOut);
          iVar11 = 3;
          iVar8 = clock_gettime(3,&local_60);
          if (iVar8 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          local_50 = lVar13 - local_70;
          Abc_Print(iVar11,"%s =","Time");
          Abc_Print(iVar11,"%9.2f sec\n",(double)local_50 / 1000000.0);
        }
        pPars->iOutFail = iOut;
        Cec_ManTransformPattern(p,iOut,(int *)0x0);
        if (((*(uint *)local_48 ^ *(uint *)pGVar2) >> 0x1d & 1) != 0) {
          __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                        ,0xc3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
        }
        uVar14 = *(ulong *)pGVar16;
        if ((((uint)uVar14 & 0x9fffffff) == 0x9fffffff) &&
           ((int)((uint)(uVar14 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs))
        goto LAB_00638d37;
        uVar14 = *(ulong *)pGVar3;
        goto LAB_00638d28;
      }
      iOut = iOut + 1;
      pGVar12 = (Gia_Man_t *)((long)&pGVar12->pName + 2);
    } while ((int)pGVar12 < (int)uVar9);
  }
  iVar11 = -1;
  if ((p->nObjs == iVar8 + p->vCis->nSize + 1) && (iVar11 = 1, pPars->fSilent == 0)) {
    Abc_Print((int)pGVar12,"Networks are equivalent.  ");
    iVar10 = 3;
    iVar8 = clock_gettime(3,&local_60);
    if (iVar8 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar10,"%s =","Time");
    Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar13 - local_70) / 1000000.0);
  }
  return iVar11;
}

Assistant:

int Cec_ManHandleSpecialCases( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    Gia_Obj_t * pObj1, * pObj2;
    Gia_Obj_t * pDri1, * pDri2;
    int i;
    abctime clk = Abc_Clock();
    Gia_ManSetPhase( p );
    Gia_ManForEachPo( p, pObj1, i )
    {
        pObj2 = Gia_ManPo( p, ++i );
        // check if they different on all-0 pattern
        // (for example, when they have the same driver but complemented)
        if ( Gia_ObjPhase(pObj1) != Gia_ObjPhase(pObj2) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            return 0;
        }
        // get the drivers
        pDri1 = Gia_ObjFanin0(pObj1);
        pDri2 = Gia_ObjFanin0(pObj2);
        // drivers are different PIs
        if ( Gia_ObjIsPi(p, pDri1) && Gia_ObjIsPi(p, pDri2) && pDri1 != pDri2 )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // if their compl attributes are the same - one should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            return 0;
        }
        // one of the drivers is a PI; another is a constant 0
        if ( (Gia_ObjIsPi(p, pDri1) && Gia_ObjIsConst0(pDri2)) || 
             (Gia_ObjIsPi(p, pDri2) && Gia_ObjIsConst0(pDri1)) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // the compl attributes are the same - the PI should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            if ( Gia_ObjIsPi(p, pDri1) )
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            else
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri2) );
            return 0;
        }
    }
    if ( Gia_ManAndNum(p) == 0 )
    {
        if ( !pPars->fSilent )
        {
        Abc_Print( 1, "Networks are equivalent.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        return 1;
    }
    return -1;
}